

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O0

int od_ec_decode_cdf_q15(od_ec_dec *dec,uint16_t *icdf,int nsyms)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int N;
  int ret;
  uint v;
  uint u;
  uint c;
  uint r;
  od_ec_window dif;
  uint in_stack_ffffffffffffffc8;
  od_ec_window in_stack_ffffffffffffffcc;
  int iVar1;
  
  iVar1 = -1;
  do {
    iVar1 = iVar1 + 1;
  } while (*(uint *)(in_RDI + 0x20) >> 0x10 <
           ((in_EDX + -1) - iVar1) * 4 +
           ((uint)(*(ushort *)(in_RDI + 0x24) >> 8) *
            ((int)(uint)*(ushort *)(in_RSI + (long)iVar1 * 2) >> 6) >> 1));
  iVar1 = od_ec_dec_normalize((od_ec_dec *)CONCAT44(iVar1,in_EDX + -1),in_stack_ffffffffffffffcc,
                              in_stack_ffffffffffffffc8,0);
  return iVar1;
}

Assistant:

int od_ec_decode_cdf_q15(od_ec_dec *dec, const uint16_t *icdf, int nsyms) {
  od_ec_window dif;
  unsigned r;
  unsigned c;
  unsigned u;
  unsigned v;
  int ret;
  (void)nsyms;
  dif = dec->dif;
  r = dec->rng;
  const int N = nsyms - 1;

  assert(dif >> (OD_EC_WINDOW_SIZE - 16) < r);
  assert(icdf[nsyms - 1] == OD_ICDF(CDF_PROB_TOP));
  assert(32768U <= r);
  assert(7 - EC_PROB_SHIFT >= 0);
  c = (unsigned)(dif >> (OD_EC_WINDOW_SIZE - 16));
  v = r;
  ret = -1;
  do {
    u = v;
    v = ((r >> 8) * (uint32_t)(icdf[++ret] >> EC_PROB_SHIFT) >>
         (7 - EC_PROB_SHIFT));
    v += EC_MIN_PROB * (N - ret);
  } while (c < v);
  assert(v < u);
  assert(u <= r);
  r = u - v;
  dif -= (od_ec_window)v << (OD_EC_WINDOW_SIZE - 16);
  return od_ec_dec_normalize(dec, dif, r, ret);
}